

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O2

void __thiscall despot::Adventurer::PrintTransitions(Adventurer *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  int i;
  ulong uVar8;
  ulong uVar9;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Transitions (Start)");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar9 = 0;
  while( true ) {
    iVar3 = (**(code **)(*(long *)this + 0xf8))(this);
    if ((long)iVar3 <= (long)uVar9) break;
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "--------------------------------------------------------------------------------"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"State ");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)uVar9);
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar5 = (**(code **)(*(long *)this + 0x108))(this,uVar9 & 0xffffffff);
    (**(code **)(*(long *)this + 0x88))(this,uVar5,&std::cout);
    lVar7 = 0;
    while( true ) {
      iVar3 = (**(code **)(*(long *)this + 0x28))(this);
      if (iVar3 <= lVar7) break;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar4 = std::operator<<(poVar4," outcomes for action ");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)lVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      lVar6 = 0xc;
      for (uVar8 = 0;
          lVar1 = *(long *)&(this->transition_probabilities_).
                            super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar9].
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            ._M_impl.super__Vector_impl_data,
          lVar2 = *(long *)(lVar1 + lVar7 * 0x18),
          uVar8 < (ulong)(*(long *)(lVar1 + 8 + lVar7 * 0x18) - lVar2 >> 5); uVar8 = uVar8 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Next = (");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*(int *)(lVar2 + lVar6));
        std::operator<<(poVar4,", ");
        poVar4 = std::ostream::_M_insert<double>(*(double *)(lVar2 + 0xc + lVar6));
        poVar4 = std::operator<<(poVar4,")");
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar5 = (**(code **)(*(long *)this + 0x108))(this,*(undefined4 *)(lVar2 + lVar6));
        (**(code **)(*(long *)this + 0x88))(this,uVar5,&std::cout);
        lVar6 = lVar6 + 0x20;
      }
      lVar7 = lVar7 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Transitions (End)");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void Adventurer::PrintTransitions() const {
	cout << "Transitions (Start)" << endl;
	for (int s = 0; s < NumStates(); s++) {
		cout
			<< "--------------------------------------------------------------------------------"
			<< endl;
		cout << "State " << s << endl;
		PrintState(*GetState(s));
		for (int a = 0; a < NumActions(); a++) {
			cout << transition_probabilities_[s][a].size()
				<< " outcomes for action " << a << endl;
			for (int i = 0; i < transition_probabilities_[s][a].size(); i++) {
				const State& next = transition_probabilities_[s][a][i];
				cout << "Next = (" << next.state_id << ", " << next.weight
					<< ")" << endl;
				PrintState(*GetState(next.state_id));
			}
		}
	}
	cout << "Transitions (End)" << endl;
}